

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_color nk_hsv(int h,int s,int v)

{
  nk_color nVar1;
  
  nVar1 = nk_hsva(h,s,v,0xff);
  return nVar1;
}

Assistant:

NK_API struct nk_color
nk_hsv(int h, int s, int v)
{
    return nk_hsva(h, s, v, 255);
}